

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeVertices
          (VertexVaryingShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  VertexPacket *pVVar2;
  ulong uVar3;
  Vec4 color;
  Vec4 local_58;
  Vec4 local_48;
  
  if (0 < numPackets && *(int *)&(this->super_ShaderProgram).field_0x154 != -1) {
    uVar3 = 0;
    do {
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib
                (&local_58,inputs + 1,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
      pVVar2 = packets[uVar3];
      *(undefined8 *)(pVVar2->position).m_data = local_48.m_data._0_8_;
      *(undefined8 *)((pVVar2->position).m_data + 2) = local_48.m_data._8_8_;
      pVVar2 = packets[uVar3];
      pVVar2->pointSize = 1.0;
      iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar1 == 2) {
        pVVar2->outputs[0].v.fData[0] = local_58.m_data[0] * 0.5;
        pVVar2->outputs[0].v.fData[1] = local_58.m_data[1] * 0.5;
        pVVar2->outputs[0].v.fData[2] = local_58.m_data[2] * 0.5;
        pVVar2->outputs[0].v.fData[3] = local_58.m_data[3] * 0.5;
        pVVar2[1].instanceNdx = (int)(local_58.m_data[2] * 0.5);
        pVVar2[1].vertexNdx = (int)(local_58.m_data[1] * 0.5);
        pVVar2[1].position.m_data[0] = local_58.m_data[0] * 0.5;
        pVVar2[1].position.m_data[1] = local_58.m_data[3] * 0.5;
      }
      else if (iVar1 == 1) {
        *(undefined8 *)&pVVar2->outputs[0].v = local_58.m_data._0_8_;
        *(undefined8 *)((long)&pVVar2->outputs[0].v + 8) = local_58.m_data._8_8_;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)numPackets != uVar3);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	// vertex shader is no-op
	if (m_vertexOut == -1)
		return;

	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		const tcu::Vec4 color = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);

		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;

		switch (m_vertexOut)
		{
			case 0:
				break;

			case 1:
				packets[ndx]->outputs[0] = color;
				break;

			case 2:
				packets[ndx]->outputs[0] = color * 0.5f;
				packets[ndx]->outputs[1] = color.swizzle(2,1,0,3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}